

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall compiler::CompilerAstWalker::loadVariable(CompilerAstWalker *this,string *str)

{
  pointer *ppVVar1;
  size_type *psVar2;
  pointer pCVar3;
  size_t __n;
  element_type *peVar4;
  shared_ptr<compiler::EmissionContext> *psVar5;
  CompilerAstWalker *pCVar6;
  bool bVar7;
  int iVar8;
  pointer pCVar9;
  long lVar10;
  size_t sVar11;
  ByteCode bc;
  ByteCode bc_00;
  ByteCode bc_01;
  undefined1 local_98 [8];
  ClosureContext cc;
  size_t index;
  size_t index_1;
  CompilerAstWalker *local_50;
  element_type *local_48;
  element_type *local_40;
  shared_ptr<compiler::EmissionContext> ec;
  
  bVar7 = EmissionContext::GetDeclarationIndex
                    ((this->ec).
                     super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,str,&cc.localScopeIndex,false);
  if (bVar7) {
    bc.parameter = cc.localScopeIndex;
    bc._0_8_ = 0xf;
    EmissionContext::EmitByteCode
              ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,bc);
  }
  else {
    local_48 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    pCVar9 = (local_48->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar3 = (local_48->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = this;
    if (pCVar9 != pCVar3) {
      index_1 = (size_t)(str->_M_dataplus)._M_p;
      __n = str->_M_string_length;
      sVar11 = 0;
      do {
        if (((pCVar9->value)._M_string_length == __n) &&
           ((__n == 0 ||
            (iVar8 = bcmp((pCVar9->value)._M_dataplus._M_p,(void *)index_1,__n), iVar8 == 0)))) {
          bc_00.parameter = sVar11;
          bc_00._0_8_ = 0x28;
          EmissionContext::EmitByteCode(local_48,bc_00);
          return;
        }
        sVar11 = sVar11 + 1;
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != pCVar3);
    }
    local_40 = (local_48->outerContext).
               super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_48->outerContext).
         super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppVVar1 = &((ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->variables).
                   super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppVVar1 = *(int *)ppVVar1 + 1;
        UNLOCK();
      }
      else {
        ppVVar1 = &((ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->variables).
                   super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppVVar1 = *(int *)ppVVar1 + 1;
      }
    }
    lVar10 = 1;
    psVar2 = &cc.value._M_string_length;
    while( true ) {
      peVar4 = local_40;
      local_98 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "Emission context was nullptr when we expected one in resolving closure","");
      Error::assertWithPanic(peVar4 != (element_type *)0x0,(string *)local_98);
      if (local_98 != (undefined1  [8])psVar2) {
        operator_delete((void *)local_98,
                        CONCAT71(cc.value._M_string_length._1_7_,
                                 (undefined1)cc.value._M_string_length) + 1);
      }
      bVar7 = EmissionContext::GetDeclarationIndex(local_40,str,&index,true);
      if (bVar7) break;
      psVar5 = &local_40->outerContext;
      local_40 = (local_40->outerContext).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec,
                 &(psVar5->super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      lVar10 = lVar10 + 1;
    }
    cc.value._M_dataplus._M_p = (pointer)0x0;
    cc.value._M_string_length._0_1_ = 0;
    local_98 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_assign((string *)local_98);
    pCVar6 = local_50;
    cc.outerScopeCount = index;
    peVar4 = (local_50->ec).
             super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar9 = (peVar4->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar3 = (peVar4->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    cc.value.field_2._8_8_ = lVar10;
    std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::push_back
              (&peVar4->closures,(value_type *)local_98);
    bc_01.parameter = ((long)pCVar3 - (long)pCVar9 >> 4) * -0x5555555555555555;
    bc_01._0_8_ = 0x28;
    EmissionContext::EmitByteCode
              ((pCVar6->ec).
               super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               bc_01);
    if (local_98 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_98,
                      CONCAT71(cc.value._M_string_length._1_7_,(undefined1)cc.value._M_string_length
                              ) + 1);
    }
    if (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
  }
  return;
}

Assistant:

void loadVariable(const std::string& str) noexcept {
    std::size_t index;
    if (this->ec->GetDeclarationIndex(str, index, false)) {
      // it's a local
      this->emit(bytecode::ByteCodeInstruction::LoadLocal, index);
    } else {
      // it's a closure
      std::size_t i = 0;
      for (const auto& cc : this->ec->closures) {
        if (cc.value == str) {
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, i);
          return;
        }
        i++;
      }
      // if we've gotten to this point, we need to add a new closure
      std::size_t localOffsets = 1;
      auto ec = this->ec->outerContext;

      while (true) {
        Error::assertWithPanic(ec != nullptr, "Emission context was nullptr when we expected one in resolving closure");
        std::size_t index;
        if (ec->GetDeclarationIndex(str, index, true)) {
          ClosureContext cc;
          cc.value = str;
          cc.outerScopeCount = localOffsets;
          cc.localScopeIndex = index;
          std::size_t closureIndex = this->ec->closures.size();
          this->ec->closures.push_back(cc);
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, closureIndex);
          return;
        }
        ec = ec->outerContext;
        localOffsets++;
      }
    }
  }